

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblySource.cpp
# Opt level: O1

void __thiscall
Js::WebAssemblySource::ReadBufferSource
          (WebAssemblySource *this,Var val,ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  BOOL BVar6;
  TypedArrayBase *pTVar7;
  ArrayBuffer *pAVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  Recycler *this_00;
  BYTE *dst;
  undefined1 local_58 [8];
  TrackAllocData data;
  Type src;
  
  bVar3 = VarIs<Js::TypedArrayBase>(val);
  if (bVar3) {
    pTVar7 = VarTo<Js::TypedArrayBase>(val);
    src = pTVar7->buffer;
    uVar4 = pTVar7->BYTES_PER_ELEMENT * (pTVar7->super_ArrayBufferParent).super_ArrayObject.length;
  }
  else {
    bVar3 = VarIs<Js::ArrayBuffer>(val);
    if (!bVar3) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e4a6,(PCWSTR)0x0);
    }
    pAVar8 = VarTo<Js::ArrayBuffer>(val);
    iVar5 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar8);
    src = (Type)CONCAT44(extraout_var,iVar5);
    uVar4 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(pAVar8);
  }
  this->bufferLength = uVar4;
  if ((src == (Type)0x0) && (uVar4 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WebAssemblySource.cpp"
                                ,0x2f,"(srcBuffer || bufferLength == 0)",
                                "srcBuffer || bufferLength == 0");
    if (!bVar3) goto LAB_0096b4f4;
    *puVar9 = 0;
  }
  data.plusSize = (size_t)this->bufferLength;
  if (data.plusSize != 0) {
    local_58 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_484245f;
    data.filename._0_4_ = 0x33;
    this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
    uVar1 = this->bufferLength;
    if ((ulong)uVar1 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      dst = &DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0096b4f4;
        *puVar9 = 0;
      }
      dst = (BYTE *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                              (this_00,(ulong)uVar1);
      if (dst == (BYTE *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_0096b4f4:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
    }
    this->buffer = dst;
    js_memcpy_s(dst,(ulong)this->bufferLength,src,(ulong)this->bufferLength);
  }
  return;
}

Assistant:

void WebAssemblySource::ReadBufferSource(Var val, ScriptContext * scriptContext)
{
    BYTE* srcBuffer;
    if (Js::VarIs<Js::TypedArrayBase>(val))
    {
        Js::TypedArrayBase* array = Js::VarTo<Js::TypedArrayBase>(val);
        srcBuffer = array->GetByteBuffer();
        bufferLength = array->GetByteLength();
    }
    else if (Js::VarIs<Js::ArrayBuffer>(val))
    {
        Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(val);
        srcBuffer = arrayBuffer->GetBuffer();
        bufferLength = arrayBuffer->GetByteLength();
    }
    else
    {
        // The buffer was not a TypedArray nor an ArrayBuffer
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    Assert(srcBuffer || bufferLength == 0);
    if (bufferLength > 0)
    {
        // copy buffer so external changes to it don't cause issues when defer parsing
        buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), byte, bufferLength);
        js_memcpy_s(buffer, bufferLength, srcBuffer, bufferLength);
    }
}